

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carray.hpp
# Opt level: O3

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<char[8],void>::operator()
          (void *this,packer<msgpack::v1::sbuffer> *o,char (*v) [8])

{
  uint16_t val;
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  int __fd;
  sbuffer *this_00;
  char buf;
  char buf_1 [2];
  char buf_2 [3];
  byte local_23 [3];
  undefined1 local_20;
  ushort local_1f;
  undefined1 local_1d;
  uint local_1c;
  size_t __n;
  
  pvVar1 = memchr(v,0,8);
  uVar2 = (int)pvVar1 - (int)v;
  __n = (size_t)uVar2;
  uVar3 = 8;
  if (pvVar1 != (void *)0x0) {
    uVar3 = uVar2;
  }
  if (uVar3 < 0x20) {
    local_23[0] = (byte)uVar3 | 0xa0;
    __fd = (int)local_23;
    this_00 = o->m_stream;
    pvVar1 = (void *)0x1;
  }
  else if (uVar3 < 0x100) {
    __fd = (int)local_23 + 1;
    local_23[1] = 0xd9;
    this_00 = o->m_stream;
    pvVar1 = (void *)0x2;
    local_23[2] = (byte)uVar3;
  }
  else if (uVar3 < 0x10000) {
    __fd = (int)&local_20;
    local_20 = 0xda;
    local_1f = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
    this_00 = o->m_stream;
    pvVar1 = (void *)0x3;
  }
  else {
    __fd = (int)&local_1d;
    local_1d = 0xdb;
    local_1c = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    this_00 = o->m_stream;
    pvVar1 = (void *)0x5;
  }
  sbuffer::write(this_00,__fd,pvVar1,__n);
  sbuffer::write(o->m_stream,(int)v,(void *)(ulong)uVar3,__n);
  return o;
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const char(&v)[N]) const {
        char const* p = v;
        uint32_t size = checked_get_container_size(N);
        char const* p2 = static_cast<char const*>(std::memchr(p, '\0', size));
        uint32_t adjusted_size = p2 ? static_cast<uint32_t>(p2 - p) : size;
        o.pack_str(adjusted_size);
        o.pack_str_body(p, adjusted_size);
        return o;
    }